

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

ImFont * __thiscall
ImFontAtlas::AddFontFromFileTTF
          (ImFontAtlas *this,char *filename,float size_pixels,ImFontConfig *font_cfg_template,
          ImWchar *glyph_ranges)

{
  void *ttf_data;
  size_t sVar1;
  ImFont *pIVar2;
  void *in_RDX;
  char *in_RSI;
  byte *in_RDI;
  bool bVar3;
  float in_XMM0_Da;
  char *p;
  ImFontConfig font_cfg;
  void *data;
  size_t data_size;
  ImFontConfig *in_stack_ffffffffffffff20;
  uint3 in_stack_ffffffffffffff34;
  uint padding_bytes;
  size_t *in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  char local_6a [26];
  ImWchar *in_stack_ffffffffffffffb0;
  ImFontConfig *in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  ImFontAtlas *this_00;
  char *pcVar4;
  
  padding_bytes = (uint)in_stack_ffffffffffffff34;
  if ((*in_RDI & 1) == 0) {
    padding_bytes = CONCAT13(1,in_stack_ffffffffffffff34);
  }
  if ((char)(padding_bytes >> 0x18) == '\0') {
    __assert_fail("!Locked && \"Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                  ,0x7a3,
                  "ImFont *ImFontAtlas::AddFontFromFileTTF(const char *, float, const ImFontConfig *, const ImWchar *)"
                 );
  }
  this_00 = (ImFontAtlas *)0x0;
  ttf_data = ImFileLoadToMemory(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                                in_stack_ffffffffffffff38,padding_bytes);
  if (ttf_data == (void *)0x0) {
    __assert_fail("(0) && \"Could not load font file!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                  ,0x7a8,
                  "ImFont *ImFontAtlas::AddFontFromFileTTF(const char *, float, const ImFontConfig *, const ImWchar *)"
                 );
  }
  if (in_RDX == (void *)0x0) {
    ImFontConfig::ImFontConfig(in_stack_ffffffffffffff20);
  }
  else {
    memcpy(&stack0xffffffffffffff40,in_RDX,0x88);
  }
  if (local_6a[0] == '\0') {
    pcVar4 = in_RSI;
    sVar1 = strlen(in_RSI);
    in_RSI = in_RSI + sVar1;
    while( true ) {
      bVar3 = false;
      if ((pcVar4 < in_RSI) && (bVar3 = false, in_RSI[-1] != '/')) {
        bVar3 = in_RSI[-1] != '\\';
      }
      if (!bVar3) break;
      in_RSI = in_RSI + -1;
    }
    ImFormatString((char *)(double)in_XMM0_Da,(size_t)local_6a,(char *)0x28,"%s, %.0fpx",in_RSI);
  }
  pIVar2 = AddFontFromMemoryTTF
                     (this_00,ttf_data,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,
                      in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  return pIVar2;
}

Assistant:

ImFont* ImFontAtlas::AddFontFromFileTTF(const char* filename, float size_pixels, const ImFontConfig* font_cfg_template, const ImWchar* glyph_ranges)
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    size_t data_size = 0;
    void* data = ImFileLoadToMemory(filename, "rb", &data_size, 0);
    if (!data)
    {
        IM_ASSERT_USER_ERROR(0, "Could not load font file!");
        return NULL;
    }
    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    if (font_cfg.Name[0] == '\0')
    {
        // Store a short copy of filename into into the font name for convenience
        const char* p;
        for (p = filename + strlen(filename); p > filename && p[-1] != '/' && p[-1] != '\\'; p--) {}
        ImFormatString(font_cfg.Name, IM_ARRAYSIZE(font_cfg.Name), "%s, %.0fpx", p, size_pixels);
    }
    return AddFontFromMemoryTTF(data, (int)data_size, size_pixels, &font_cfg, glyph_ranges);
}